

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O3

bool __thiscall
Parameter<unsigned_long>::setData(Parameter<unsigned_long> *this,unsigned_long lival)

{
  (this->super_ParameterBase).empty_ = false;
  this->data_ = lival;
  return true;
}

Assistant:

bool internalSetData(T data) {
    ParamType tmp {};
    bool result = ValueType::convert(data, tmp);
    if (result) {
      empty_ = false;
      data_  = tmp;
    }
    return result;
  }